

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  longlong *plVar3;
  undefined8 uVar4;
  SQFunctionProto *pSVar5;
  SQInteger x;
  SQUnsignedInteger ni;
  SQUnsignedInteger nf;
  ulong uVar6;
  long lVar7;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr refidx;
  
  pSVar5 = SQFunctionProto::Create
                     (this->_ss,(this->_instructions)._size,this->_nliterals,
                      (this->_parameters)._size,(this->_functions)._size,(this->_outervalues)._size,
                      (this->_lineinfos)._size,(this->_localvarinfos)._size,
                      (this->_defaultparams)._size);
  refidx.super_SQObject._type = OT_NULL;
  refidx.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  pSVar5->_stacksize = this->_stacksize;
  SQObjectPtr::operator=(&pSVar5->_sourcename,&this->_sourcename);
  pSVar5->_bgenerator = this->_bgenerator;
  SQObjectPtr::operator=(&pSVar5->_name,&this->_name);
  while( true ) {
    x = SQTable::Next((this->_literals).super_SQObject._unVal.pTable,false,&refidx,&key,&val);
    if (x == -1) break;
    SQObjectPtr::operator=(pSVar5->_literals + val.super_SQObject._unVal.nInteger,&key);
    SQObjectPtr::operator=(&refidx,x);
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < (this->_functions)._size; uVar6 = uVar6 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar5->_functions->super_SQObject)._type + lVar7),
               (SQObjectPtr *)((long)&(((this->_functions)._vals)->super_SQObject)._type + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < (this->_parameters)._size; uVar6 = uVar6 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar5->_parameters->super_SQObject)._type + lVar7),
               (SQObjectPtr *)((long)&(((this->_parameters)._vals)->super_SQObject)._type + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < (this->_outervalues)._size; uVar6 = uVar6 + 1) {
    SQOuterVar::operator=
              ((SQOuterVar *)((long)&pSVar5->_outervalues->_type + lVar7),
               (SQOuterVar *)((long)&((this->_outervalues)._vals)->_type + lVar7));
    lVar7 = lVar7 + 0x28;
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < (this->_localvarinfos)._size; uVar6 = uVar6 + 1) {
    SQLocalVarInfo::operator=
              ((SQLocalVarInfo *)
               ((long)&(pSVar5->_localvarinfos->_name).super_SQObject._type + lVar7),
               (SQLocalVarInfo *)
               ((long)&(((this->_localvarinfos)._vals)->_name).super_SQObject._type + lVar7));
    lVar7 = lVar7 + 0x28;
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < (this->_lineinfos)._size; uVar6 = uVar6 + 1) {
    puVar1 = (undefined8 *)((long)&((this->_lineinfos)._vals)->_line + lVar7);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pSVar5->_lineinfos->_line + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar7 = lVar7 + 0x10;
  }
  plVar3 = (this->_defaultparams)._vals;
  for (uVar6 = 0; uVar6 < (this->_defaultparams)._size; uVar6 = uVar6 + 1) {
    pSVar5->_defaultparams[uVar6] = plVar3[uVar6];
  }
  memcpy(pSVar5->_instructions,(this->_instructions)._vals,(this->_instructions)._size << 3);
  pSVar5->_varparams = (ulong)this->_varparams;
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  SQObjectPtr::~SQObjectPtr(&refidx);
  return pSVar5;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{

    SQFunctionProto *f=SQFunctionProto::Create(_ss,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}